

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O1

size_t __thiscall cppurses::Text_display::first_index_at(Text_display *this,size_t line)

{
  pointer pLVar1;
  ulong uVar2;
  ulong uVar3;
  
  pLVar1 = (this->display_state_).
           super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)(this->display_state_).
                super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1 >> 4;
  uVar3 = uVar2 - 1;
  if (line < uVar2) {
    uVar3 = line;
  }
  if (uVar3 < uVar2) {
    return pLVar1[uVar3].start_index;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

std::size_t Text_display::first_index_at(std::size_t line) const {
    if (line >= display_state_.size()) {
        line = display_state_.size() - 1;
    }
    return display_state_.at(line).start_index;
}